

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest3_4::inspectProgramInterfaceiv
          (FunctionalTest3_4 *this,GLuint program_id)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  GLenum aGStack_70 [2];
  inspectionDetailsForProgramInterface details [5];
  
  details[0].program_interface = 0x92ee;
  details[0].pname = 0x92f5;
  details[0].expected_value = this->m_n_active_subroutine_uniforms;
  details[1].program_interface = 0x92ee;
  details[1].pname = 0x92f6;
  details[1].expected_value = this->m_n_active_subroutine_uniform_name_length + 1;
  details[2].program_interface = 0x92ee;
  details[2].pname = 0x92f8;
  details[2].expected_value = this->m_n_active_subroutines;
  details[3].program_interface = 0x92e8;
  details[3].pname = 0x92f5;
  details[3].expected_value = this->m_n_active_subroutines;
  details[4].program_interface = 0x92e8;
  details[4].pname = 0x92f6;
  details[4].expected_value = this->m_n_active_subroutine_name_length + 1;
  bVar2 = true;
  for (lVar3 = 8; lVar3 != 0x44; lVar3 = lVar3 + 0xc) {
    aGStack_70[0] = 0xa1a84b;
    aGStack_70[1] = 0;
    bVar1 = checkProgramInterfaceiv
                      (this,program_id,*(GLenum *)((long)details + lVar3 + -8),
                       *(GLenum *)((long)details + lVar3 + -4),
                       *(GLint *)((long)&details[0].program_interface + lVar3));
    bVar2 = (bool)(bVar2 & bVar1);
  }
  return bVar2;
}

Assistant:

bool FunctionalTest3_4::inspectProgramInterfaceiv(glw::GLuint program_id) const
{
	bool result = true;

	const inspectionDetailsForProgramInterface details[] = {
		{ GL_VERTEX_SUBROUTINE_UNIFORM, GL_ACTIVE_RESOURCES, m_n_active_subroutine_uniforms },
		{ GL_VERTEX_SUBROUTINE_UNIFORM, GL_MAX_NAME_LENGTH, m_n_active_subroutine_uniform_name_length + 1 },
		{ GL_VERTEX_SUBROUTINE_UNIFORM, GL_MAX_NUM_COMPATIBLE_SUBROUTINES, m_n_active_subroutines },
		{ GL_VERTEX_SUBROUTINE, GL_ACTIVE_RESOURCES, m_n_active_subroutines },
		{ GL_VERTEX_SUBROUTINE, GL_MAX_NAME_LENGTH, m_n_active_subroutine_name_length + 1 }
	};
	const GLuint n_details = sizeof(details) / sizeof(details[0]);

	for (GLuint i = 0; i < n_details; ++i)
	{
		if (false == checkProgramInterfaceiv(program_id, details[i].program_interface, details[i].pname,
											 details[i].expected_value))
		{
			result = false;
		}
	}

	return result;
}